

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O1

reference __thiscall
pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>::
emplace_back<pstore::index::details::internal_node_const&>
          (chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul> *this,
          internal_node *args)

{
  reference pvVar1;
  long lVar2;
  
  if (*(long *)(this + 0x10) != 0) {
    lVar2 = *(long *)(this + 8);
    if (0x2aa9 < *(ulong *)(lVar2 + 0x10)) {
      std::__cxx11::
      list<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
      ::emplace_back<>((list<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
                        *)this);
      lVar2 = *(long *)(this + 8);
    }
    pvVar1 = chunk::emplace_back<pstore::index::details::internal_node_const&>
                       ((chunk *)(lVar2 + 0x10),args);
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    return pvVar1;
  }
  assert_failed("chunks_.size () > 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/chunked_sequence.hpp"
                ,0x129);
}

Assistant:

auto
    chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::emplace_back (Args &&... args)
        -> reference {
        PSTORE_ASSERT (chunks_.size () > 0U);
        auto * tail = &chunks_.back ();
        if (PSTORE_UNLIKELY (tail->size () >= ElementsPerChunk)) {
            // Append a new chunk.
            chunks_.emplace_back ();
            tail = &chunks_.back ();
        }
        // Append a new instance to the tail chunk.
        reference result = tail->emplace_back (std::forward<Args> (args)...);
        ++size_;
        return result;
    }